

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,_QFileInfo>_>::insert
          (QMovableArrayOps<std::pair<QString,_QFileInfo>_> *this,qsizetype i,qsizetype n,
          parameter_type t)

{
  long lVar1;
  uint uVar2;
  Inserter *in_RCX;
  long lVar3;
  long in_RDX;
  QArrayDataPointer<std::pair<QString,_QFileInfo>_> *in_RSI;
  pair<QString,_QFileInfo> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  pair<QString,_QFileInfo> copy;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::pair<QString,_QFileInfo>::pair
            ((pair<QString,_QFileInfo> *)
             CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),in_RDI);
  bVar4 = (in_RDI->first).d.size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0x0;
  uVar6 = CONCAT13(uVar5,(int3)in_stack_ffffffffffffff8c);
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0x0);
  QArrayDataPointer<std::pair<QString,_QFileInfo>_>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),(qsizetype)in_RCX,
             (pair<QString,_QFileInfo> **)CONCAT44(uVar6,uVar2),
             (QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)
             CONCAT17(uVar5,in_stack_ffffffffffffff80));
  if ((uVar6 & 0x1000000) == 0) {
    Inserter::Inserter(in_RCX,(QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)
                              CONCAT44(uVar6,uVar2),CONCAT17(uVar5,in_stack_ffffffffffffff80),
                       (qsizetype)in_RDI);
    Inserter::insertFill
              (in_RCX,(pair<QString,_QFileInfo> *)CONCAT44(uVar6,uVar2),
               CONCAT17(uVar5,in_stack_ffffffffffffff80));
    Inserter::~Inserter((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff80));
  }
  else {
    while (lVar3 = in_RDX + -1, in_RDX != 0) {
      QArrayDataPointer<std::pair<QString,_QFileInfo>_>::begin
                ((QArrayDataPointer<std::pair<QString,_QFileInfo>_> *)0xa9e348);
      std::pair<QString,_QFileInfo>::pair
                ((pair<QString,_QFileInfo> *)CONCAT17(uVar5,in_stack_ffffffffffffff80),in_RDI);
      (in_RDI->first).d.ptr = (in_RDI->first).d.ptr + -0x10;
      (in_RDI->first).d.size = (in_RDI->first).d.size + 1;
      in_RDX = lVar3;
    }
  }
  std::pair<QString,_QFileInfo>::~pair
            ((pair<QString,_QFileInfo> *)CONCAT17(uVar5,in_stack_ffffffffffffff80));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }